

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<jsonrpccxx::error_type,jsonrpccxx::error_type>
          (String *__return_storage_ptr__,detail *this,error_type *lhs,char *op,error_type *rhs)

{
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toString<jsonrpccxx::error_type,_true>(&local_48,(error_type *)this);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  toString<jsonrpccxx::error_type,_true>(&SStack_78,(error_type *)op);
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }